

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

void __thiscall ddd::DictionaryMLT<false,_true>::pack(DictionaryMLT<false,_true> *this)

{
  pointer ptVar1;
  thread *th;
  pointer ptVar2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  type func;
  uint local_4c;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  type local_30;
  thread local_28;
  
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30.this = (DictionaryMLT<false,_false> *)this;
  std::vector<std::thread,_std::allocator<std::thread>_>::resize
            (&local_48,*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3);
  for (local_4c = 0;
      ptVar1 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish,
      ptVar2 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start,
      (ulong)local_4c < (ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3);
      local_4c = local_4c + 1) {
    std::thread::
    thread<ddd::DictionaryMLT<false,true>::pack()::_lambda(unsigned_int)_1_&,unsigned_int&,void>
              (&local_28,&local_30,&local_4c);
    std::thread::operator=
              (local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start + local_4c,&local_28);
    std::thread::~thread(&local_28);
  }
  for (; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  return;
}

Assistant:

void pack() {
    auto func = [&](uint32_t id) {
      if (suffix_subtries_[id]) {
        suffix_subtries_[id]->pack_bc();
        suffix_subtries_[id]->pack_tail();
      }
    };

    std::vector<std::thread> threads;
    threads.resize(suffix_subtries_.size());
    for (uint32_t i = 0; i < suffix_subtries_.size(); ++i) {
      threads[i] = std::thread(func, i);
    }
    for (auto& th : threads) {
      th.join();
    }
  }